

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939cat.c
# Opt level: O1

int j1939cat_recv_err(j1939cat_priv *priv)

{
  sock_extended_err *psVar1;
  timespec *cur;
  uint uVar2;
  ssize_t sVar3;
  cmsghdr *__cmsg;
  int *piVar4;
  __u32 __errnum;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  sock_extended_err *serr;
  char control [200];
  msghdr local_130;
  cmsghdr local_f8 [12];
  
  local_130.msg_name = (void *)0x0;
  local_130.msg_namelen = 0;
  local_130.msg_iov = (iovec *)0x0;
  local_130.msg_iovlen = 0;
  local_130.msg_control = local_f8;
  local_130.msg_controllen = 200;
  local_130.msg_flags = 0;
  sVar3 = recvmsg(priv->sock,&local_130,0x2000);
  if ((int)sVar3 == -1) {
    piVar4 = __errno_location();
    err(1,"recvmsg error notification: %i",*piVar4);
  }
  if ((local_130.msg_flags & 8U) != 0) {
    err(1,"recvmsg error notification: truncated");
  }
  priv->serr = (sock_extended_err *)0x0;
  priv->tss = (scm_timestamping *)0x0;
  if ((cmsghdr *)local_130.msg_control != (cmsghdr *)0x0 && 0xf < local_130.msg_controllen) {
    __cmsg = (cmsghdr *)local_130.msg_control;
    do {
      if (__cmsg->cmsg_len == 0) {
        return 0;
      }
      iVar8 = __cmsg->cmsg_level;
      if (iVar8 == 0x6b) {
        if (__cmsg->cmsg_type == 4) {
          priv->serr = (sock_extended_err *)(__cmsg + 1);
          goto LAB_00103137;
        }
LAB_00103125:
        warnx("serr: not supported type: %d.%d",iVar8,__cmsg->cmsg_type);
      }
      else {
        if (iVar8 != 1) goto LAB_00103125;
        if (__cmsg->cmsg_type == 0x36) {
          iVar8 = (int)__cmsg->cmsg_len + -0x10;
          if (0 < iVar8) {
            uVar2 = 0;
            do {
              uVar5 = (ulong)uVar2;
              switch(*(undefined2 *)((long)&__cmsg[1].cmsg_len + uVar5 + 2)) {
              case 1:
                (priv->stats).send = *(uint32_t *)((long)&__cmsg[1].cmsg_len + uVar5 + 4);
                break;
              case 2:
                (priv->stats).total = *(uint32_t *)((long)&__cmsg[1].cmsg_len + uVar5 + 4);
                break;
              case 3:
                (priv->stats).pgn = *(uint32_t *)((long)&__cmsg[1].cmsg_len + uVar5 + 4);
                break;
              case 4:
                (priv->stats).src_name = *(uint64_t *)((long)&__cmsg[1].cmsg_len + uVar5 + 4);
                break;
              case 5:
                (priv->stats).dst_name = *(uint64_t *)((long)&__cmsg[1].cmsg_len + uVar5 + 4);
                break;
              case 6:
                (priv->stats).sa = *(uint8_t *)((long)&__cmsg[1].cmsg_len + uVar5 + 4);
                break;
              case 7:
                (priv->stats).da = *(uint8_t *)((long)&__cmsg[1].cmsg_len + uVar5 + 4);
                break;
              default:
                warnx("not supported J1939_NLA field\n");
              }
              uVar2 = (*(ushort *)((long)&__cmsg[1].cmsg_len + uVar5) + 3 & 0xfffffffc) + uVar2;
            } while ((int)uVar2 < iVar8);
          }
        }
        else {
          if (__cmsg->cmsg_type != 0x25) goto LAB_00103125;
          priv->tss = (scm_timestamping *)(__cmsg + 1);
        }
      }
LAB_00103137:
      psVar1 = priv->serr;
      if ((psVar1 != (sock_extended_err *)0x0) && (cur = priv->tss->ts, cur != (timespec *)0x0)) {
        if (psVar1->ee_origin == '\x01') {
          switch(psVar1->ee_info) {
          case 1:
            j1939cat_print_timestamp(priv,"TX ABT",cur);
            __errnum = psVar1->ee_errno;
            pcVar6 = strerror(__errnum);
            pcVar7 = "serr: tx error: %i, %s";
            break;
          case 2:
            j1939cat_recv_err_cold_1();
            return 0;
          case 3:
            (priv->stats).tskey = psVar1->ee_data;
            j1939cat_print_timestamp(priv,"RX DPO",cur);
            if (priv->last_dpo != 0xffffffff && (priv->stats).send <= (uint)priv->last_dpo) {
              warnx("same dpo? current: %i, last: %i");
            }
            priv->last_dpo = (priv->stats).send;
            return 0;
          case 4:
            j1939cat_print_timestamp(priv,"RX ABT",cur);
            __errnum = psVar1->ee_errno;
            pcVar6 = strerror(__errnum);
            pcVar7 = "serr: rx error: %i, %s";
            break;
          default:
            warnx("serr: unknown ee_info: %i");
            return -0x5f;
          }
          warnx(pcVar7,__errnum,pcVar6);
          return psVar1->ee_errno;
        }
        if (psVar1->ee_origin == '\x04') {
          if (psVar1->ee_errno != 0x2a) {
            warnx("serr: expected ENOMSG, got: %i");
          }
          (priv->stats).tskey = psVar1->ee_data;
          if ((ulong)psVar1->ee_info < 3) {
            pcVar6 = &DAT_00106290 + *(int *)(&DAT_00106290 + (ulong)psVar1->ee_info * 4);
          }
          else {
            pcVar6 = "   unk";
          }
          j1939cat_print_timestamp(priv,pcVar6,cur);
          return (uint)(psVar1->ee_info != 1) * 4 + -4;
        }
        warnx("serr: wrong origin: %u");
        return 0;
      }
      __cmsg = __cmsg_nxthdr(&local_130,__cmsg);
    } while (__cmsg != (cmsghdr *)0x0);
  }
  return 0;
}

Assistant:

static int j1939cat_recv_err(struct j1939cat_priv *priv)
{
	char control[200];
	struct cmsghdr *cm;
	int ret;
	struct msghdr msg = {
		.msg_control = control,
		.msg_controllen = sizeof(control),
	};

	ret = recvmsg(priv->sock, &msg, MSG_ERRQUEUE);
	if (ret == -1)
		err(EXIT_FAILURE, "recvmsg error notification: %i", errno);
	if (msg.msg_flags & MSG_CTRUNC)
		err(EXIT_FAILURE, "recvmsg error notification: truncated");

	priv->serr = NULL;
	priv->tss = NULL;

	for (cm = CMSG_FIRSTHDR(&msg); cm && cm->cmsg_len;
	     cm = CMSG_NXTHDR(&msg, cm)) {
		j1939cat_parse_cm(priv, cm);
		if (priv->serr && priv->tss)
			return j1939cat_extract_serr(priv);
	}

	return 0;
}